

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O3

OpenMPClause *
OpenMPDefaultClause::addDefaultClause
          (OpenMPDirective *directive,OpenMPDefaultClauseKind default_kind)

{
  mapped_type *ppvVar1;
  ostream *poVar2;
  vector<OpenMPClause*,std::allocator<OpenMPClause*>> *this;
  OpenMPClause *local_38;
  key_type local_2c;
  
  local_38 = (OpenMPClause *)CONCAT44(local_38._4_4_,2);
  ppvVar1 = std::
            map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
            ::operator[](&directive->clauses,(key_type *)&local_38);
  if (((*ppvVar1)->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      ((*ppvVar1)->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_38 = (OpenMPClause *)operator_new(0x78);
    (local_38->super_SourceLocation).line = 0;
    (local_38->super_SourceLocation).column = 0;
    (local_38->super_SourceLocation).parent_construct = (SourceLocation *)0x0;
    local_38->kind = OMPC_default;
    local_38->clause_position = -1;
    (local_38->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_38->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_38->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_38->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_38->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_38->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_38->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_38->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_38->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38->_vptr_OpenMPClause = (_func_int **)&PTR_toString_abi_cxx11__001b95b0;
    *(OpenMPDefaultClauseKind *)&local_38[1]._vptr_OpenMPClause = default_kind;
    local_38[1].super_SourceLocation.line = 0;
    local_38[1].super_SourceLocation.column = 0;
    this = (vector<OpenMPClause*,std::allocator<OpenMPClause*>> *)operator_new(0x18);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 *)(this + 0x10) = 0;
    std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>::_M_realloc_insert<OpenMPClause*const&>
              (this,(iterator)0x0,&local_38);
    local_2c = OMPC_default;
    ppvVar1 = std::
              map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
              ::operator[](&directive->clauses,&local_2c);
    *ppvVar1 = (mapped_type)this;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot have two default clause for the directive ",0x31);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,directive->kind);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ignored\n",10);
    local_38 = (OpenMPClause *)0x0;
  }
  return local_38;
}

Assistant:

OpenMPClause* OpenMPDefaultClause::addDefaultClause(OpenMPDirective *directive, OpenMPDefaultClauseKind default_kind) {

    std::map<OpenMPClauseKind, std::vector<OpenMPClause*>* >* all_clauses = directive->getAllClauses();
    std::vector<OpenMPClause*>* current_clauses = directive->getClauses(OMPC_default);
    OpenMPClause* new_clause = NULL;

    if (current_clauses->size() == 0) {
        new_clause = new OpenMPDefaultClause(default_kind);
        current_clauses = new std::vector<OpenMPClause*>();
        current_clauses->push_back(new_clause);
        (*all_clauses)[OMPC_default] = current_clauses;
    } else { /* could be an error since if clause may only appear once */
        std::cerr << "Cannot have two default clause for the directive " << directive->getKind() << ", ignored\n";
    };

    return new_clause;
}